

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# res0.c
# Opt level: O0

int res2_inverse(vorbis_block *vb,vorbis_look_residue *vl,float **in,int *nonzero,int ch)

{
  int n_00;
  long *plVar1;
  codebook *book;
  int iVar2;
  int iVar3;
  void *pvVar4;
  long lVar5;
  int local_a8;
  codebook *stagebook;
  int temp;
  int **partword;
  int partwords;
  int partvals;
  int n;
  int end;
  int max;
  int partitions_per_word;
  int samples_per_partition;
  vorbis_info_residue0 *info;
  vorbis_look_residue0 *look;
  long s;
  long l;
  long k;
  long i;
  int ch_local;
  int *nonzero_local;
  float **in_local;
  vorbis_look_residue *vl_local;
  vorbis_block *vb_local;
  
  plVar1 = *vl;
  n_00 = (int)plVar1[2];
  iVar2 = (int)**(undefined8 **)((long)vl + 0x18);
  local_a8 = vb->pcmend * ch >> 1;
  if (plVar1[1] < (long)local_a8) {
    local_a8 = (int)plVar1[1];
  }
  local_a8 = local_a8 - (int)*plVar1;
  if (0 < local_a8) {
    local_a8 = local_a8 / n_00;
    pvVar4 = _vorbis_block_alloc(vb,(long)((local_a8 + iVar2 + -1) / iVar2) << 3);
    for (k = 0; (k < ch && (nonzero[k] == 0)); k = k + 1) {
    }
    if (k != ch) {
      for (look = (vorbis_look_residue0 *)0x0; (long)look < (long)*(int *)((long)vl + 0xc);
          look = (vorbis_look_residue0 *)((long)&look->info + 1)) {
        k = 0;
        s = 0;
        while (k < local_a8) {
          if (look == (vorbis_look_residue0 *)0x0) {
            lVar5 = vorbis_book_decode(*(codebook **)((long)vl + 0x18),&vb->opb);
            iVar3 = (int)lVar5;
            if (iVar3 == -1) {
              return 0;
            }
            if ((int)plVar1[3] <= iVar3) {
              return 0;
            }
            *(undefined8 *)((long)pvVar4 + s * 8) =
                 *(undefined8 *)(*(long *)((long)vl + 0x30) + (long)iVar3 * 8);
            if (*(long *)((long)pvVar4 + s * 8) == 0) {
              return 0;
            }
          }
          for (l = 0; l < iVar2 && k < local_a8; l = l + 1) {
            if ((((*(uint *)((long)plVar1 +
                            (long)*(int *)(*(long *)((long)pvVar4 + s * 8) + l * 4) * 4 + 0x20) &
                  1 << ((byte)look & 0x1f)) != 0) &&
                (book = *(codebook **)
                         (*(long *)(*(long *)((long)vl + 0x20) +
                                   (long)*(int *)(*(long *)((long)pvVar4 + s * 8) + l * 4) * 8) +
                         (long)look * 8), book != (codebook *)0x0)) &&
               (lVar5 = vorbis_book_decodevv_add(book,in,k * n_00 + *plVar1,ch,&vb->opb,n_00),
               lVar5 == -1)) {
              return 0;
            }
            k = k + 1;
          }
          s = s + 1;
        }
      }
    }
  }
  return 0;
}

Assistant:

int res2_inverse(vorbis_block *vb,vorbis_look_residue *vl,
                 float **in,int *nonzero,int ch){
  long i,k,l,s;
  vorbis_look_residue0 *look=(vorbis_look_residue0 *)vl;
  vorbis_info_residue0 *info=look->info;

  /* move all this setup out later */
  int samples_per_partition=info->grouping;
  int partitions_per_word=look->phrasebook->dim;
  int max=(vb->pcmend*ch)>>1;
  int end=(info->end<max?info->end:max);
  int n=end-info->begin;

  if(n>0){
    int partvals=n/samples_per_partition;
    int partwords=(partvals+partitions_per_word-1)/partitions_per_word;
    int **partword=_vorbis_block_alloc(vb,partwords*sizeof(*partword));

    for(i=0;i<ch;i++)if(nonzero[i])break;
    if(i==ch)return(0); /* no nonzero vectors */

    for(s=0;s<look->stages;s++){
      for(i=0,l=0;i<partvals;l++){

        if(s==0){
          /* fetch the partition word */
          int temp=vorbis_book_decode(look->phrasebook,&vb->opb);
          if(temp==-1 || temp>=info->partvals)goto eopbreak;
          partword[l]=look->decodemap[temp];
          if(partword[l]==NULL)goto errout;
        }

        /* now we decode residual values for the partitions */
        for(k=0;k<partitions_per_word && i<partvals;k++,i++)
          if(info->secondstages[partword[l][k]]&(1<<s)){
            codebook *stagebook=look->partbooks[partword[l][k]][s];

            if(stagebook){
              if(vorbis_book_decodevv_add(stagebook,in,
                                          i*samples_per_partition+info->begin,ch,
                                          &vb->opb,samples_per_partition)==-1)
                goto eopbreak;
            }
          }
      }
    }
  }
 errout:
 eopbreak:
  return(0);
}